

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5PoslistFilterCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  byte *in_RDX;
  long *in_RSI;
  long in_FS_OFFSET;
  bool bVar5;
  int iStart;
  int i;
  PoslistCallbackCtx *pCtx;
  int iCol_1;
  int iCol;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int iVar6;
  int iVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < in_ECX) {
    iVar7 = 0;
    iVar6 = 0;
    if ((int)in_RSI[2] == 2) {
      iVar7 = 1;
      bVar1 = *in_RDX;
      if ((bVar1 & 0x80) != 0) {
        iVar3 = 0;
        iVar7 = sqlite3Fts5GetVarint32((uchar *)in_RSI,(u32 *)0x0);
        iVar7 = iVar7 + iVar3;
      }
      iVar3 = fts5IndexColsetTest((Fts5Colset *)in_RSI[1],(uint)bVar1);
      if (iVar3 == 0) {
        *(undefined4 *)(in_RSI + 2) = 0;
      }
      else {
        *(undefined4 *)(in_RSI + 2) = 1;
        iVar3 = sqlite3Fts5PutVarint
                          ((uchar *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                           0x281ea1);
        *(int *)(*in_RSI + 8) = iVar3 + *(int *)(*in_RSI + 8);
      }
    }
    do {
      while( true ) {
        bVar5 = false;
        if (iVar7 < in_ECX) {
          bVar5 = in_RDX[iVar7] != 1;
        }
        if (!bVar5) break;
        while ((in_RDX[iVar7] & 0x80) != 0) {
          iVar7 = iVar7 + 1;
        }
        iVar7 = iVar7 + 1;
      }
      iVar3 = iVar7;
      if ((int)in_RSI[2] != 0) {
        memcpy((void *)(*(long *)*in_RSI + (long)*(int *)(*in_RSI + 8)),in_RDX + iVar6,
               (long)(iVar7 - iVar6));
        *(int *)(*in_RSI + 8) = (iVar7 - iVar6) + *(int *)(*in_RSI + 8);
        iVar3 = iVar7;
      }
      iVar7 = iVar3;
      if (iVar3 < in_ECX) {
        iVar4 = iVar3 + 1;
        if (iVar4 < in_ECX) {
          iVar7 = iVar3 + 2;
          bVar1 = in_RDX[iVar4];
          if ((bVar1 & 0x80) != 0) {
            iVar6 = iVar3 + 1;
            iVar7 = sqlite3Fts5GetVarint32((uchar *)in_RSI,(u32 *)CONCAT44(iVar6,iVar3));
            iVar7 = iVar7 + iVar6;
          }
          iVar6 = fts5IndexColsetTest((Fts5Colset *)in_RSI[1],(uint)bVar1);
          *(int *)(in_RSI + 2) = iVar6;
          iVar6 = iVar3;
          if ((int)in_RSI[2] != 0) {
            iVar6 = iVar7;
            memcpy((void *)(*(long *)*in_RSI + (long)*(int *)(*in_RSI + 8)),in_RDX + iVar3,
                   (long)(iVar7 - iVar3));
            *(int *)(*in_RSI + 8) = (iVar6 - iVar3) + *(int *)(*in_RSI + 8);
            iVar7 = iVar6;
          }
        }
        else {
          *(undefined4 *)(in_RSI + 2) = 2;
          iVar6 = iVar3;
          iVar7 = iVar4;
        }
      }
    } while (iVar7 < in_ECX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5PoslistFilterCallback(
  Fts5Index *pUnused,
  void *pContext,
  const u8 *pChunk, int nChunk
){
  PoslistCallbackCtx *pCtx = (PoslistCallbackCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    /* Search through to find the first varint with value 1. This is the
    ** start of the next columns hits. */
    int i = 0;
    int iStart = 0;

    if( pCtx->eState==2 ){
      int iCol;
      fts5FastGetVarint32(pChunk, i, iCol);
      if( fts5IndexColsetTest(pCtx->pColset, iCol) ){
        pCtx->eState = 1;
        fts5BufferSafeAppendVarint(pCtx->pBuf, 1);
      }else{
        pCtx->eState = 0;
      }
    }

    do {
      while( i<nChunk && pChunk[i]!=0x01 ){
        while( pChunk[i] & 0x80 ) i++;
        i++;
      }
      if( pCtx->eState ){
        fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
      }
      if( i<nChunk ){
        int iCol;
        iStart = i;
        i++;
        if( i>=nChunk ){
          pCtx->eState = 2;
        }else{
          fts5FastGetVarint32(pChunk, i, iCol);
          pCtx->eState = fts5IndexColsetTest(pCtx->pColset, iCol);
          if( pCtx->eState ){
            fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
            iStart = i;
          }
        }
      }
    }while( i<nChunk );
  }
}